

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_ld_e_d8_Test::~CpuTest_ld_e_d8_Test(CpuTest_ld_e_d8_Test *this)

{
  CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ld_e_d8) {
    regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

    EXPECT_CALL(mmu, read_byte(regs.pc + 1)).WillOnce(Return(0x33));

    execute_instruction(0x1E);

    ICpu::Registers expected_regs{};
    expected_regs.e = 0x33;
    expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
    expected_regs.pc = 2;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}